

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O0

void avro::testStreamLifetimes(void)

{
  type pEVar1;
  element_type *peVar2;
  type pEVar3;
  auto_ptr<avro::OutputStream> s2;
  auto_ptr<avro::OutputStream> s1;
  EncoderPtr e;
  auto_ptr<avro::OutputStream> *in_stack_ffffffffffffffc0;
  auto_ptr<avro::OutputStream> local_30 [3];
  auto_ptr<avro::OutputStream> local_18;
  shared_ptr<avro::Encoder> local_10;
  
  avro::binaryEncoder();
  avro::memoryOutputStream((ulong)&local_18);
  pEVar1 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  peVar2 = std::auto_ptr<avro::OutputStream>::operator*(&local_18);
  (**(code **)(*(long *)pEVar1 + 0x10))(pEVar1,peVar2);
  pEVar1 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  (**(code **)(*(long *)pEVar1 + 0x30))(pEVar1,100);
  pEVar1 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  (**(code **)(*(long *)pEVar1 + 0x48))(0x4012eb851eb851ec);
  pEVar1 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  (**(code **)(*(long *)pEVar1 + 0x18))();
  std::auto_ptr<avro::OutputStream>::~auto_ptr(in_stack_ffffffffffffffc0);
  avro::memoryOutputStream((ulong)local_30);
  pEVar1 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  peVar2 = std::auto_ptr<avro::OutputStream>::operator*(local_30);
  (**(code **)(*(long *)pEVar1 + 0x10))(pEVar1,peVar2);
  pEVar3 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  (**(code **)(*(long *)pEVar3 + 0x48))(0x40091eb851eb851f);
  pEVar3 = boost::shared_ptr<avro::Encoder>::operator->(&local_10);
  (**(code **)(*(long *)pEVar3 + 0x18))();
  std::auto_ptr<avro::OutputStream>::~auto_ptr((auto_ptr<avro::OutputStream> *)pEVar1);
  boost::shared_ptr<avro::Encoder>::~shared_ptr((shared_ptr<avro::Encoder> *)0x225c73);
  return;
}

Assistant:

static void testStreamLifetimes()
{
    EncoderPtr e = binaryEncoder();
    {
        std::auto_ptr<OutputStream> s1 = memoryOutputStream();
        e->init(*s1);
        e->encodeInt(100);
        e->encodeDouble(4.73);
        e->flush();
    }

    {
        std::auto_ptr<OutputStream> s2 = memoryOutputStream();
        e->init(*s2);
        e->encodeDouble(3.14);
        e->flush();
    }

}